

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

string * __thiscall
stackjit::Loader::Function::className_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->mClassName);
  return __return_storage_ptr__;
}

Assistant:

std::string Loader::Function::className() const {
		return mClassName;
	}